

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int64_t TPZSkylMatrix<float>::NumElements(TPZVec<long> *skyline)

{
  int64_t iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = 0;
  lVar2 = skyline->fNElements;
  if (skyline->fNElements < 1) {
    lVar2 = iVar1;
  }
  for (lVar3 = 1; lVar3 - lVar2 != 1; lVar3 = lVar3 + 1) {
    iVar1 = (iVar1 - skyline->fStore[lVar3 + -1]) + lVar3;
  }
  return iVar1;
}

Assistant:

int64_t TPZSkylMatrix<TVar>::NumElements(const TPZVec<int64_t> &skyline) {
	int64_t dim = skyline.NElements();
	int64_t i;
	int64_t nelem=0;
	for(i=0; i<dim; i++) {
		nelem += i-skyline[i]+1;
	}
	return nelem;
}